

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O3

int read_int32(coda_cursor_conflict *cursor,int32_t *dst)

{
  coda_backend cVar1;
  int iVar2;
  
  cVar1 = (cursor->stack[(long)cursor->n + -1].type)->backend;
  switch(cVar1) {
  case coda_backend_memory:
    iVar2 = coda_mem_cursor_read_int32(cursor,dst);
    return iVar2;
  case coda_backend_hdf4:
    iVar2 = -0xb;
    break;
  case coda_backend_hdf5:
    iVar2 = -0xd;
    break;
  case coda_backend_cdf:
    iVar2 = coda_cdf_cursor_read_int32(cursor,dst);
    return iVar2;
  case coda_backend_netcdf:
    iVar2 = coda_netcdf_cursor_read_int32(cursor,dst);
    return iVar2;
  case coda_backend_grib:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                  ,499,"int read_int32(const coda_cursor *, int32_t *)");
  default:
    if (cVar1 == coda_backend_binary) {
      iVar2 = coda_bin_cursor_read_int32(cursor,dst);
      return iVar2;
    }
    if (cVar1 != coda_backend_ascii) {
      return 0;
    }
    iVar2 = coda_ascii_cursor_read_int32(cursor,dst);
    return iVar2;
  }
  coda_set_error(iVar2,(char *)0x0);
  return -1;
}

Assistant:

static int read_int32(const coda_cursor *cursor, int32_t *dst)
{
    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            return coda_ascii_cursor_read_int32(cursor, dst);
        case coda_backend_binary:
            return coda_bin_cursor_read_int32(cursor, dst);
        case coda_backend_memory:
            return coda_mem_cursor_read_int32(cursor, dst);
            break;
        case coda_backend_hdf4:
#ifdef HAVE_HDF4
            return coda_hdf4_cursor_read_int32(cursor, dst);
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_hdf5:
#ifdef HAVE_HDF5
            return coda_hdf5_cursor_read_int32(cursor, dst);
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_cdf:
            return coda_cdf_cursor_read_int32(cursor, dst);
        case coda_backend_netcdf:
            return coda_netcdf_cursor_read_int32(cursor, dst);
        case coda_backend_grib:
            assert(0);
            exit(1);
    }

    return 0;
}